

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  long lVar1;
  longlong lVar2;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong pos;
  ContentEncAESSettings *aes_local;
  IMkvReader *pReader_local;
  longlong size_local;
  longlong start_local;
  ContentEncoding *this_local;
  
  pos = (longlong)aes;
  aes_local = (ContentEncAESSettings *)pReader;
  pReader_local = (IMkvReader *)size;
  size_local = start;
  start_local = (longlong)this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x104f,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  if (aes == (ContentEncAESSettings *)0x0) {
    __assert_fail("aes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1050,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  id = start + size;
  stop = start;
  do {
    if (id <= stop) {
      return 0;
    }
    lVar1 = ParseElementHeader((IMkvReader *)aes_local,&stop,id,&size_1,&status);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (size_1 == 0x47e8) {
      lVar2 = UnserializeUInt((IMkvReader *)aes_local,stop,status);
      *(longlong *)pos = lVar2;
      if (*(long *)pos != 1) {
        return -2;
      }
    }
    stop = status + stop;
  } while (stop <= id);
  return -2;
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}